

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

bool __thiscall
Compressor::encodeHeaderlessChunk
          (Compressor *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *output,
          Image *input,Type type,bool isSwitch)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *output_00;
  runtime_error *this_01;
  ushort in_CX;
  int *in_RDX;
  uint8_t *in_RSI;
  long *in_RDI;
  byte in_R8B;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *img_1;
  int p2_1;
  int p1_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *img;
  int p2;
  int p1;
  Image *local;
  Image _local;
  Image *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffed8;
  Image *in_stack_fffffffffffffee0;
  Image *in_stack_fffffffffffffef0;
  Image *in_stack_fffffffffffffef8;
  Size in_stack_ffffffffffffff00;
  int *p2_00;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  Impl *in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff4f;
  unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
  *in_stack_ffffffffffffff50;
  Image *in_stack_ffffffffffffff58;
  Impl *in_stack_ffffffffffffff60;
  int local_88;
  int local_74;
  undefined1 local_54 [4];
  undefined4 local_50;
  undefined4 uStack_4c;
  int local_48 [9];
  byte local_23;
  ushort local_22;
  int *local_20;
  uint8_t *local_18;
  byte local_1;
  
  local_23 = in_R8B & 1;
  local_50 = 0;
  uStack_4c = 0;
  local_22 = in_CX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  memset(local_54,0,4);
  Image::Image(in_stack_fffffffffffffef0,in_stack_ffffffffffffff00,
               SUB84((ulong)in_stack_fffffffffffffef8 >> 0x20,0));
  p2_00 = local_20;
  if ((local_23 & 1) == 0) {
    p2_00 = local_48;
  }
  if ((local_23 & 1) == 0) {
    Image::operator=((Image *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    swapBR(in_stack_fffffffffffffee0);
  }
  if (local_22 < 2) {
    prepareWriteRGB((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10b3f3);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(*in_RDI + 0x70));
    compress((Compressor *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
             (uint8_t *)in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
    local_1 = 1;
  }
  else if (local_22 == 2) {
    Impl::getPalettes(in_stack_ffffffffffffff30,
                      (Image *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                      (int *)in_RDI,p2_00);
    if (local_88 < 0) {
      local_1 = 0;
    }
    else {
      this_00 = Impl::writePaletted(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                    in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f);
      pvVar1 = this_00;
      output_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10b5c1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
      compress((Compressor *)pvVar1,output_00,local_18,
               (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
      local_1 = 1;
    }
  }
  else {
    if (local_22 != 3) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string((int)((ulong)p2_00 >> 0x20));
      std::operator+((char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      std::runtime_error::runtime_error(this_01,(string *)&stack0xffffffffffffff50);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Impl::getPalettes(in_stack_ffffffffffffff30,
                      (Image *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                      (int *)in_RDI,p2_00);
    if (local_74 < 0) {
      local_1 = 0;
    }
    else {
      pvVar1 = Impl::writePaletted(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                   in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10b4da);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar1);
      compress((Compressor *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               (uint8_t *)in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
      local_1 = 1;
    }
  }
  Image::~Image((Image *)0x10b6fe);
  return (bool)(local_1 & 1);
}

Assistant:

bool Compressor::encodeHeaderlessChunk(std::vector<uint8_t>& output, const Image& input, ChunkHeader::Type type, bool isSwitch) {
	Image _local;
	const Image& local = isSwitch ? input : _local;
	if (!isSwitch) {
		_local = input;
		swapBR(_local);
	}
	switch (type) {
		case ChunkHeader::TYPE_COLOR:
		case ChunkHeader::TYPE_COLOR1:
			prepareWriteRGB(impl->scratch, local);
			compress(output, impl->scratch.data(), impl->scratch.size(), isSwitch);
			return true;

		case ChunkHeader::TYPE_INDEXED: {
			int p1, p2;
			impl->getPalettes(input, p1, p2);
			if (p1 < 0) { return false; }
			auto& img = impl->writePaletted(local, impl->palette1, false);
			compress(output, img.data(), img.size(), isSwitch);
			return true;
		}

		case ChunkHeader::TYPE_INDEXED_ALPHA: {
			int p1, p2;
			impl->getPalettes(input, p1, p2);
			if (p2 < 0) { return false; }
			auto& img = impl->writePaletted(local, impl->palette2, true);
			compress(output, img.data(), img.size(), isSwitch);
			return true;
		}
	}
	throw std::runtime_error("Unexpected type " + std::to_string(type));
}